

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitConstantArgsToIntArray
               (ByteCodeGenerator *byteCodeGenerator,int32 *vars,ParseNode *args,uint argCount)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeInt *pPVar6;
  ulong uVar7;
  
  OVar3 = args->nop;
  if (argCount == 0 || OVar3 != knopList) {
    uVar7 = 0;
    if (argCount == 0) goto LAB_0080f298;
  }
  else {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar7 = 0;
    do {
      pPVar5 = ParseNode::AsParseNodeBin(args);
      if (pPVar5->pnode1->nop != knopInt) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1e4e,"(args->AsParseNodeBin()->pnode1->nop == knopInt)",
                           "args->AsParseNodeBin()->pnode1->nop == knopInt");
        if (!bVar2) goto LAB_0080f371;
        *puVar4 = 0;
      }
      pPVar5 = ParseNode::AsParseNodeBin(args);
      pPVar6 = ParseNode::AsParseNodeInt(pPVar5->pnode1);
      vars[uVar7] = pPVar6->lw;
      uVar7 = uVar7 + 1;
      pPVar5 = ParseNode::AsParseNodeBin(args);
      args = pPVar5->pnode2;
      OVar3 = args->nop;
    } while ((OVar3 == knopList) && (uVar7 < argCount));
    if (argCount <= uVar7) {
LAB_0080f298:
      Js::Throw::InternalError();
    }
  }
  if (OVar3 != knopInt) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1e59,"(args->nop == knopInt)","args->nop == knopInt");
    if (!bVar2) goto LAB_0080f371;
    *puVar4 = 0;
  }
  pPVar6 = ParseNode::AsParseNodeInt(args);
  vars[uVar7 & 0xffffffff] = pPVar6->lw;
  if ((int)uVar7 + 1U != argCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1e5c,"(index == argCount)","index == argCount");
    if (!bVar2) {
LAB_0080f371:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void EmitConstantArgsToIntArray(ByteCodeGenerator *byteCodeGenerator, __out_ecount(argCount) int32 *vars, ParseNode *args, uint argCount)
{
    uint index = 0;
    while (args->nop == knopList && index < argCount)
    {
        Assert(args->AsParseNodeBin()->pnode1->nop == knopInt);
        vars[index++] = args->AsParseNodeBin()->pnode1->AsParseNodeInt()->lw;
        args = args->AsParseNodeBin()->pnode2;
    }

    if (index >= argCount)
    {
        Js::Throw::InternalError();
        return;
    }

    Assert(args->nop == knopInt);
    vars[index++] = args->AsParseNodeInt()->lw;

    Assert(index == argCount);
}